

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::VirtualInterfaceType::fromSyntax
                 (ASTContext *context,VirtualInterfaceTypeSyntax *syntax)

{
  Token *this;
  Compilation *pCVar1;
  Scope *scope;
  VirtualInterfaceTypeSyntax *pVVar2;
  Symbol *definition;
  InstanceSymbol *symbol;
  ModportSymbol *pMVar3;
  Type *pTVar4;
  Diagnostic *pDVar5;
  VirtualInterfaceType *pVVar6;
  string_view sVar7;
  SourceRange SVar8;
  ModportSymbol *modport;
  SourceLocation loc;
  bool local_71;
  VirtualInterfaceTypeSyntax *local_70;
  Compilation *local_68;
  ModportSymbol *local_60;
  SourceRange local_58;
  DefinitionLookupResult local_48;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  this = &syntax->name;
  sVar7 = parsing::Token::valueText(this);
  if (sVar7._M_len == 0) {
    pTVar4 = pCVar1->errorType;
  }
  else {
    scope = (context->scope).ptr;
    local_70 = syntax;
    local_58 = parsing::Token::range(this);
    local_68 = pCVar1;
    Compilation::getDefinition(&local_48,pCVar1,sVar7,scope,local_58,(DiagCode)0xce0006);
    definition = local_48.definition;
    if ((DefinitionSymbol *)local_48.definition != (DefinitionSymbol *)0x0) {
      if ((((Symbol *)&(local_48.definition)->kind)->kind == Definition) &&
         (*(DefinitionKind *)((long)local_48.definition + 0x48) == Interface)) {
        local_48.definition = (Symbol *)parsing::Token::location(this);
        pVVar2 = local_70;
        symbol = InstanceSymbol::createVirtual
                           (context,(SourceLocation)local_48.definition,
                            (DefinitionSymbol *)definition,local_70->parameters);
        pCVar1 = local_68;
        Compilation::noteVirtualIfaceInstance(local_68,symbol);
        local_60 = (ModportSymbol *)0x0;
        pMVar3 = local_60;
        if (((pVVar2->modport != (DotMemberClauseSyntax *)0x0) &&
            ((sVar7 = parsing::Token::valueText(&pVVar2->modport->member), pMVar3 = local_60,
             sVar7._M_len != 0 && (local_70->modport != (DotMemberClauseSyntax *)0x0)))) &&
           ((pMVar3 = (ModportSymbol *)Scope::find(&symbol->body->super_Scope,sVar7),
            pMVar3 == (ModportSymbol *)0x0 || ((pMVar3->super_Symbol).kind != Modport)))) {
          SVar8 = parsing::Token::range(&local_70->modport->member);
          pDVar5 = ASTContext::addDiag(context,(DiagCode)0x22000a,SVar8);
          Diagnostic::operator<<(pDVar5,sVar7);
          Diagnostic::operator<<(pDVar5,((Symbol *)&definition->kind)->name);
          pMVar3 = local_60;
        }
        local_60 = pMVar3;
        local_71 = false;
        pVVar6 = BumpAllocator::
                 emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation&>
                           (&pCVar1->super_BumpAllocator,symbol,&local_60,&local_71,
                            (SourceLocation *)&local_48);
        return &pVVar6->super_Type;
      }
      SVar8 = parsing::Token::range(this);
      pDVar5 = ASTContext::addDiag(context,(DiagCode)0xce0006,SVar8);
      Diagnostic::operator<<(pDVar5,sVar7);
    }
    pTVar4 = local_68->errorType;
  }
  return pTVar4;
}

Assistant:

const Type& VirtualInterfaceType::fromSyntax(const ASTContext& context,
                                             const VirtualInterfaceTypeSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto ifaceName = syntax.name.valueText();
    if (ifaceName.empty())
        return comp.getErrorType();

    auto def = comp.getDefinition(ifaceName, *context.scope, syntax.name.range(),
                                  diag::UnknownInterface)
                   .definition;

    if (!def || def->kind != SymbolKind::Definition ||
        def->as<DefinitionSymbol>().definitionKind != DefinitionKind::Interface) {

        // If we got a result from getDefinition then it didn't error, so issue
        // one ourselves since we didn't find an interface.
        if (def)
            context.addDiag(diag::UnknownInterface, syntax.name.range()) << ifaceName;
        return comp.getErrorType();
    }

    auto loc = syntax.name.location();
    auto& iface = InstanceSymbol::createVirtual(context, loc, def->as<DefinitionSymbol>(),
                                                syntax.parameters);
    comp.noteVirtualIfaceInstance(iface);

    const ModportSymbol* modport = nullptr;
    std::string_view modportName = syntax.modport ? syntax.modport->member.valueText() : ""sv;
    if (!modportName.empty() && syntax.modport) {
        auto sym = iface.body.find(modportName);
        if (!sym || sym->kind != SymbolKind::Modport) {
            SLANG_ASSERT(syntax.modport);
            auto& diag = context.addDiag(diag::NotAModport, syntax.modport->member.range());
            diag << modportName;
            diag << def->name;
        }
        else {
            modport = &sym->as<ModportSymbol>();
        }
    }

    return *comp.emplace<VirtualInterfaceType>(iface, modport, /* isRealIface */ false, loc);
}